

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

Dictionary * ASDCP::DefaultInteropDict(void)

{
  if (s_InteropDictInit == '\0') {
    pthread_mutex_lock((pthread_mutex_t *)&s_InteropDictLock);
    if (s_InteropDictInit == '\0') {
      Dictionary::Init(&s_InteropDict);
      Dictionary::DeleteEntry(&s_InteropDict,1);
      Dictionary::DeleteEntry(&s_InteropDict,0xe);
      Dictionary::DeleteEntry(&s_InteropDict,0x110);
      Dictionary::AddEntry(&s_InteropDict,s_MDD_Table + 1,2);
      Dictionary::AddEntry(&s_InteropDict,s_MDD_Table + 0xe,0xf);
      Dictionary::AddEntry(&s_InteropDict,s_MDD_Table + 0x110,0x94);
      s_InteropDictInit = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&s_InteropDictLock);
  }
  return &s_InteropDict;
}

Assistant:

const ASDCP::Dictionary&
ASDCP::DefaultInteropDict()
{
  if ( ! s_InteropDictInit )
    {
      Kumu::AutoMutex AL(s_InteropDictLock);

      if ( ! s_InteropDictInit )
	{
	  s_InteropDict.Init();

	  s_InteropDict.DeleteEntry(MDD_MXFInterop_OPAtom);
	  s_InteropDict.DeleteEntry(MDD_MXFInterop_CryptEssence);
	  s_InteropDict.DeleteEntry(MDD_MXFInterop_GenericDescriptor_SubDescriptors);

	  s_InteropDict.AddEntry(s_MDD_Table[MDD_MXFInterop_OPAtom], MDD_OPAtom);
	  s_InteropDict.AddEntry(s_MDD_Table[MDD_MXFInterop_CryptEssence], MDD_CryptEssence);
	  s_InteropDict.AddEntry(s_MDD_Table[MDD_MXFInterop_GenericDescriptor_SubDescriptors],
				     MDD_GenericDescriptor_SubDescriptors);

	  s_InteropDictInit = true;
	}
    }

  return s_InteropDict;
}